

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool testBash(void)

{
  iterator polyRight;
  iterator this;
  Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_> *this_00;
  Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_> bb;
  BFunc<3UL> bf;
  MP<3UL,_GF2::MOGrevlex<6UL>_> p;
  MI<6UL,_GF2::MOGrevlex<6UL>_> i;
  VSubst<3UL> s;
  word s_table [8];
  undefined5 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4d;
  undefined1 in_stack_fffffffffffffd4e;
  undefined1 in_stack_fffffffffffffd4f;
  byte bVar1;
  Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>
  *in_stack_fffffffffffffd50;
  MP<3UL,_GF2::MOGrevlex<6UL>_> *in_stack_fffffffffffffd68;
  WW<6UL> in_stack_fffffffffffffd70;
  MP<3UL,_GF2::MOGrevlex<6UL>_> *in_stack_fffffffffffffd78;
  VFunc<3UL,_3UL> *in_stack_fffffffffffffd80;
  MM<6UL> *in_stack_fffffffffffffd90;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_fffffffffffffd98;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_fffffffffffffda0;
  MI<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_fffffffffffffda8;
  Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>
  *in_stack_fffffffffffffe00;
  MI<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_fffffffffffffe08;
  Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>
  *in_stack_fffffffffffffe10;
  MI<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_fffffffffffffee8;
  
  GF2::VSubst<3UL>::VSubst
            ((VSubst<3UL> *)in_stack_fffffffffffffd50,
             (word (*) [8])
             CONCAT17(in_stack_fffffffffffffd4f,
                      CONCAT16(in_stack_fffffffffffffd4e,
                               CONCAT15(in_stack_fffffffffffffd4d,in_stack_fffffffffffffd48))));
  GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::MI((MI<6UL,_GF2::MOGrevlex<6UL>_> *)0x172ae5);
  GF2::MP<3UL,_GF2::MOGrevlex<6UL>_>::MP
            ((MP<3UL,_GF2::MOGrevlex<6UL>_> *)in_stack_fffffffffffffd70._words[0],
             SUB81((ulong)in_stack_fffffffffffffd68 >> 0x38,0));
  GF2::BFunc<3UL>::BFunc((BFunc<3UL> *)in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd4f);
  GF2::VFunc<3UL,_3UL>::GetCoord
            (in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
             (BFunc<3UL> *)in_stack_fffffffffffffd70._words[0]);
  GF2::BFunc<3ul>::To<GF2::MOGrevlex<6ul>>
            ((BFunc<3UL> *)in_stack_fffffffffffffd70._words[0],in_stack_fffffffffffffd68);
  GF2::MP<6ul,GF2::MOGrevlex<6ul>>::MP<3ul,GF2::MOGrevlex<6ul>>
            ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  GF2::MM<6UL>::MM((MM<6UL> *)in_stack_fffffffffffffd50,
                   CONCAT17(in_stack_fffffffffffffd4f,
                            CONCAT16(in_stack_fffffffffffffd4e,
                                     CONCAT15(in_stack_fffffffffffffd4d,in_stack_fffffffffffffd48)))
                  );
  GF2::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  polyRight = GF2::MI<6ul,GF2::MOGrevlex<6ul>>::Insert<6ul,GF2::MOGrevlex<6ul>>
                        (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x172bb9);
  GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x172bc6);
  GF2::VFunc<3UL,_3UL>::GetCoord
            (in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
             (BFunc<3UL> *)in_stack_fffffffffffffd70._words[0]);
  GF2::BFunc<3ul>::To<GF2::MOGrevlex<6ul>>
            ((BFunc<3UL> *)in_stack_fffffffffffffd70._words[0],
             (MP<3UL,_GF2::MOGrevlex<6UL>_> *)polyRight._M_node);
  GF2::MP<6ul,GF2::MOGrevlex<6ul>>::MP<3ul,GF2::MOGrevlex<6ul>>
            ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  GF2::MM<6UL>::MM((MM<6UL> *)in_stack_fffffffffffffd50,
                   CONCAT17(in_stack_fffffffffffffd4f,
                            CONCAT16(in_stack_fffffffffffffd4e,
                                     CONCAT15(in_stack_fffffffffffffd4d,in_stack_fffffffffffffd48)))
                  );
  GF2::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  this = GF2::MI<6ul,GF2::MOGrevlex<6ul>>::Insert<6ul,GF2::MOGrevlex<6ul>>
                   (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x172c79);
  GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x172c86);
  GF2::VFunc<3UL,_3UL>::GetCoord
            (in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
             (BFunc<3UL> *)in_stack_fffffffffffffd70._words[0]);
  GF2::BFunc<3ul>::To<GF2::MOGrevlex<6ul>>
            ((BFunc<3UL> *)in_stack_fffffffffffffd70._words[0],
             (MP<3UL,_GF2::MOGrevlex<6UL>_> *)polyRight._M_node);
  GF2::MP<6ul,GF2::MOGrevlex<6ul>>::MP<3ul,GF2::MOGrevlex<6ul>>
            ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  GF2::MM<6UL>::MM((MM<6UL> *)in_stack_fffffffffffffd50,
                   CONCAT17(in_stack_fffffffffffffd4f,
                            CONCAT16(in_stack_fffffffffffffd4e,
                                     CONCAT15(in_stack_fffffffffffffd4d,in_stack_fffffffffffffd48)))
                  );
  GF2::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  GF2::MI<6ul,GF2::MOGrevlex<6ul>>::Insert<6ul,GF2::MOGrevlex<6ul>>
            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x172d39);
  GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x172d46);
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::Buchb
            ((Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_> *)
             this._M_node);
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::Init
            (in_stack_fffffffffffffd50);
  GF2::Buchb<6ul,GF2::MOGrevlex<6ul>,GF2::CritPair<6ul,GF2::MOGrevlex<6ul>>>::
  Update<GF2::MOGrevlex<6ul>>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::Process
            (in_stack_fffffffffffffe00);
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::Done
            (in_stack_fffffffffffffd50,
             (_I *)CONCAT17(in_stack_fffffffffffffd4f,
                            CONCAT16(in_stack_fffffffffffffd4e,
                                     CONCAT15(in_stack_fffffffffffffd4d,in_stack_fffffffffffffd48)))
            );
  this_00 = (Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_> *)
            GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::Size((MI<6UL,_GF2::MOGrevlex<6UL>_> *)0x172d9f);
  bVar1 = false;
  if (this_00 == (Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_> *)0xe)
  {
    GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::QuotientBasisDim(in_stack_fffffffffffffee8);
    bVar1 = GF2::WW<6UL>::operator==((WW<6UL> *)&stack0xfffffffffffffd70,8);
  }
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::~Buchb(this_00);
  GF2::MP<3UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<3UL,_GF2::MOGrevlex<6UL>_> *)0x172e09);
  GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::~MI((MI<6UL,_GF2::MOGrevlex<6UL>_> *)0x172e16);
  return (bool)(bVar1 & 1);
}

Assistant:

bool testBash()
{
	typedef MOGrevlex<6> O;
	typedef MM<6> X;
	// S-блок и его идеал
	const word s_table[] = {1, 2, 3, 4, 6, 7, 5, 0};
	VSubst<3> s(s_table);
	MI<6, O> i;
	// i <- {x_{k + 3} - s_k(x_0, s_1, x_2): k = 0, 1, 2}
	MP<3, O> p;
	BFunc<3> bf;
	s.GetCoord(0, bf);
	bf.To(p);
	i.Insert(MP<6, O>(p) + X(3));
	s.GetCoord(1, bf);
	bf.To(p);
	i.Insert(MP<6, O>(p) + X(4));
	s.GetCoord(2, bf);
	bf.To(p);
	i.Insert(MP<6, O>(p) + X(5));
	// базис Гребнера
	Buchb<6, O> bb;
	bb.Init();
	bb.Update(i);
	bb.Process();
	bb.Done(i);
	// завершение
	return i.Size() == 14 && i.QuotientBasisDim() == word(8);
}